

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastGen.hpp
# Opt level: O1

bool __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::
FastGeneralizationsIterator::enterNode(FastGeneralizationsIterator *this,Node **curr)

{
  TermList *pTVar1;
  void ***pppvVar2;
  uint uVar3;
  uint *puVar4;
  NodeAlgorithm NVar5;
  int iVar6;
  uint64_t uVar7;
  undefined4 extraout_var;
  NodeAlgorithm *pNVar8;
  Node *pNVar9;
  Node *pNVar10;
  Node *pNVar11;
  ulong uVar12;
  long *plVar13;
  long *plVar14;
  Node *pNVar15;
  NodeAlgorithm **ppNVar16;
  bool bVar17;
  Top TVar18;
  TermList binding;
  TermList local_38;
  
  pNVar10 = *curr;
  NVar5 = (*pNVar10->_vptr_Node[5])(pNVar10);
  uVar3 = *(uint *)&pNVar10[1]._vptr_Node;
  local_38._content = (this->_subst)._specVars._array[uVar3]._content;
  *curr = (Node *)0x0;
  pNVar15 = (Node *)&pNVar10[1]._term;
  if (NVar5 == UNSORTED_LIST) {
    if ((local_38._content & 3) == 0) {
      iVar6 = *(int *)(local_38._content + 8);
      pNVar9 = (Node *)((TermList *)pNVar15)->_content;
      bVar17 = pNVar9 == (Node *)0x0;
      if ((!bVar17) && (uVar12 = (pNVar9->_term)._content, (uVar12 & 3) == 0)) {
        pNVar11 = *curr;
        pNVar10 = pNVar10 + 2;
        do {
          pNVar15 = pNVar10;
          if ((pNVar11 == (Node *)0x0) && (*(int *)(uVar12 + 8) == iVar6)) {
            *curr = pNVar9;
            pNVar11 = pNVar9;
          }
          pNVar9 = (Node *)pNVar15->_vptr_Node;
          bVar17 = pNVar9 == (Node *)0x0;
          if (bVar17) break;
          uVar12 = (pNVar9->_term)._content;
          pNVar10 = (Node *)&pNVar15->_term;
        } while ((uVar12 & 3) == 0);
      }
      if (((!bVar17) && (*curr == (Node *)0x0)) &&
         (pNVar10 = (Node *)(pNVar15->_term)._content, pNVar10 != (Node *)0x0)) {
        pNVar9 = pNVar15 + 1;
        do {
          uVar12 = (pNVar10->_term)._content;
          if (((uVar12 & 3) == 0) && (*(int *)(uVar12 + 8) == iVar6)) {
            *curr = pNVar10;
            break;
          }
          pNVar10 = (Node *)pNVar9->_vptr_Node;
          pNVar9 = (Node *)&pNVar9->_term;
        } while (pNVar10 != (Node *)0x0);
      }
    }
    else {
      uVar7 = ((TermList *)pNVar15)->_content;
      while ((uVar7 != 0 && ((*(byte *)(uVar7 + 8) & 3) == 0))) {
        pTVar1 = &pNVar15->_term;
        pNVar15 = (Node *)&pNVar15->_term;
        uVar7 = pTVar1->_content;
      }
    }
    if ((*curr == (Node *)0x0) && ((Node *)pNVar15->_vptr_Node != (Node *)0x0)) {
      *curr = (Node *)pNVar15->_vptr_Node;
      do {
        pNVar15 = (Node *)&pNVar15->_term;
        if (((TermList *)pNVar15)->_content == 0) break;
      } while ((*(byte *)(((TermList *)pNVar15)->_content + 8) & 3) == 0);
    }
    if (*curr != (Node *)0x0) {
      if ((this->_specVarNumbers)._cursor == (this->_specVarNumbers)._end) {
        ::Lib::Stack<unsigned_int>::expand(&this->_specVarNumbers);
      }
      puVar4 = (this->_specVarNumbers)._cursor;
      *puVar4 = uVar3;
      (this->_specVarNumbers)._cursor = puVar4 + 1;
    }
    if (pNVar15->_vptr_Node == (_func_int **)0x0) {
      return false;
    }
    if ((this->_alternatives)._cursor == (this->_alternatives)._end) {
      ::Lib::Stack<void_*>::expand(&this->_alternatives);
    }
    *(this->_alternatives)._cursor = pNVar15;
    pppvVar2 = &(this->_alternatives)._cursor;
    *pppvVar2 = *pppvVar2 + 1;
    pNVar8 = (this->_nodeTypes)._cursor;
    NVar5 = UNSORTED_LIST;
  }
  else {
    plVar13 = *(long **)(((TermList *)pNVar15)->_content + 8);
    if ((local_38._content & 3) == 0) {
      TVar18 = Kernel::TermList::top(&local_38);
      iVar6 = (*pNVar10->_vptr_Node[10])
                        (pNVar10,TVar18._inner._inner._0_8_,
                         (ulong)(TVar18._inner._inner._8_4_ & 0xff),0);
      if ((undefined8 *)CONCAT44(extraout_var,iVar6) != (undefined8 *)0x0) {
        *curr = *(Node **)CONCAT44(extraout_var,iVar6);
      }
    }
    if ((*curr == (Node *)0x0) && (((((Node *)*plVar13)->_term)._content & 1) != 0)) {
      *curr = (Node *)*plVar13;
      plVar13 = (long *)plVar13[1];
    }
    if (plVar13 == (long *)0x0) {
      plVar14 = (long *)0x0;
    }
    else {
      plVar14 = (long *)0x0;
      if ((*(byte *)(*plVar13 + 8) & 3) != 0) {
        plVar14 = plVar13;
      }
    }
    if (*curr != (Node *)0x0) {
      uVar3 = *(uint *)&pNVar10[1]._vptr_Node;
      if ((this->_specVarNumbers)._cursor == (this->_specVarNumbers)._end) {
        ::Lib::Stack<unsigned_int>::expand(&this->_specVarNumbers);
      }
      puVar4 = (this->_specVarNumbers)._cursor;
      *puVar4 = uVar3;
      (this->_specVarNumbers)._cursor = puVar4 + 1;
    }
    if (plVar14 == (long *)0x0) {
      return false;
    }
    if ((this->_alternatives)._cursor == (this->_alternatives)._end) {
      ::Lib::Stack<void_*>::expand(&this->_alternatives);
    }
    *(this->_alternatives)._cursor = plVar14;
    pppvVar2 = &(this->_alternatives)._cursor;
    *pppvVar2 = *pppvVar2 + 1;
    pNVar8 = (this->_nodeTypes)._cursor;
  }
  ppNVar16 = &(this->_nodeTypes)._cursor;
  if (pNVar8 == (this->_nodeTypes)._end) {
    ::Lib::
    Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::NodeAlgorithm>
    ::expand(&this->_nodeTypes);
  }
  pNVar8 = *ppNVar16;
  *pNVar8 = NVar5;
  *ppNVar16 = pNVar8 + 1;
  return true;
}

Assistant:

bool SubstitutionTree<LeafData_>::FastGeneralizationsIterator::enterNode(Node*& curr)
{
  IntermediateNode* inode=static_cast<IntermediateNode*>(curr);
  NodeAlgorithm currType=inode->algorithm();

  TermList binding = _subst.getSpecVarBinding(inode->childVar);
  curr=0;

  if(currType==UNSORTED_LIST) {
    Node** nl=static_cast<UArrIntermediateNode*>(inode)->_nodes;
    if(binding.isTerm()) {
      unsigned bindingFunctor=binding.term()->functor();
      //let's first skip proper term nodes at the beginning...
      while(*nl && (*nl)->term().isTerm()) {
        //...and have the one that interests us, if we encounter it.
        if(!curr && (*nl)->term().term()->functor()==bindingFunctor) {
          curr=*nl;
        }
        nl++;
      }
      if(!curr && *nl) {
        //we've encountered a variable node, but we still have to check, whether
        //the one proper term node, that interests us, isn't here
        Node** nl2=nl+1;
        while(*nl2) {
          if((*nl2)->term().isTerm() && (*nl2)->term().term()->functor()==bindingFunctor) {
            curr=*nl2;
            break;
          }
          nl2++;
        }
      }
    } else {
      //let's first skip proper term nodes at the beginning
      while(*nl && (*nl)->term().isTerm()) {
        nl++;
      }
    }
    if(!curr && *nl) {
      curr=*(nl++);
      while(*nl && (*nl)->term().isTerm()) {
	nl++;
      }
    }
    if(curr) {
      _specVarNumbers.push(inode->childVar);
    }
    if(*nl) {
      _alternatives.push(nl);
      _nodeTypes.push(currType);
      return true;
    }
  } else {
    ASS_EQ(currType, SKIP_LIST);
    auto nl=static_cast<SListIntermediateNode*>(inode)->_nodes.listLike();
    if(binding.isTerm()) {
      Node** byTop=inode->childByTop(binding.top(), false);
      if(byTop) {
	curr=*byTop;
      }
    }
    if(!curr && nl->head()->term().isVar()) {
      curr=nl->head();
      nl=nl->tail();
    }
    //in SkipList nodes variables are only at the beginning
    //(so if there aren't any, there aren't any at all)
    if(nl && nl->head()->term().isTerm()) {
      nl=0;
    }
    if(curr) {
      _specVarNumbers.push(inode->childVar);
    }
    if(nl) {
      _alternatives.push(nl);
      _nodeTypes.push(currType);
      return true;
    }
  }
  return false;
}